

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithNaturalBoxes(Gia_Man_t *p,int nFaddMin,int fVerbose)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  void *pvVar6;
  int iVar7;
  Vec_Int_t *vFadds;
  Vec_Int_t *vMap;
  Vec_Wec_t *vChains;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vTruths;
  Gia_Man_t *pGVar9;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Tim_Man_t *pTVar14;
  Gia_Man_t *pGVar15;
  long lVar16;
  Vec_Int_t *vMap_00;
  Vec_Int_t *extraout_RDX;
  int nBoxes;
  long lVar17;
  uint uVar18;
  int iVar19;
  timespec ts;
  long local_48;
  
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar7 = Gia_ManBoxNum(p);
  if (iVar7 < 1) {
    iVar7 = Gia_ManBoxNum(p);
    if (iVar7 != 0) {
      __assert_fail("Gia_ManBoxNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x322,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    vFadds = Gia_ManDetectFullAdders(p,fVerbose,(Vec_Int_t **)0x0);
    if (0x33333332 < vFadds->nSize * -0x33333333 + 0x19999999U) {
      __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x326,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    vMap = Gia_ManCreateMap(p,vFadds);
    Gia_ManFindChains(p,vFadds,vMap);
    pGVar9 = p;
    vChains = Gia_ManCollectTopmost(p,vFadds,vMap,nFaddMin);
    pVVar8 = vMap_00;
    if (fVerbose != 0) {
      Gia_ManPrintChains(pGVar9,vFadds,vMap_00,vChains);
      pVVar8 = extraout_RDX;
    }
    if (vChains->nSize == 0) {
      if (vFadds->pArray != (int *)0x0) {
        free(vFadds->pArray);
        vFadds->pArray = (int *)0x0;
      }
      if (vFadds != (Vec_Int_t *)0x0) {
        free(vFadds);
      }
      if (vMap->pArray != (int *)0x0) {
        free(vMap->pArray);
        vMap->pArray = (int *)0x0;
      }
      if (vMap != (Vec_Int_t *)0x0) {
        free(vMap);
      }
      if (0 < vChains->nCap) {
        lVar16 = 8;
        lVar17 = 0;
        do {
          pvVar6 = *(void **)((long)&vChains->pArray->nCap + lVar16);
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
            *(undefined8 *)((long)&vChains->pArray->nCap + lVar16) = 0;
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x10;
        } while (lVar17 < vChains->nCap);
      }
      if (vChains->pArray != (Vec_Int_t *)0x0) {
        free(vChains->pArray);
        vChains->pArray = (Vec_Int_t *)0x0;
      }
      vChains->nCap = 0;
      vChains->nSize = 0;
      free(vChains);
      pGVar9 = Gia_ManDup(p);
    }
    else {
      pVVar8 = Gia_ManFindMapping(p,vFadds,pVVar8,vChains);
      vTruths = Gia_ManCollectTruthTables(p,vFadds);
      if (fVerbose != 0) {
        iVar19 = 3;
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print(iVar19,"%s =","Carry-chain detection time");
        Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar17 + lVar16) / 1000000.0);
      }
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        local_48 = 1;
      }
      else {
        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        local_48 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      Gia_ManFillValue(p);
      pGVar9 = Gia_ManStart(p->nObjs);
      pcVar2 = p->pName;
      if (pcVar2 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar2);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar2);
      }
      pGVar9->pName = pcVar11;
      pcVar2 = p->pSpec;
      if (pcVar2 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar2);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar2);
      }
      pGVar9->pSpec = pcVar11;
      p->pObjs->Value = 0;
      pVVar13 = p->vCis;
      if (0 < pVVar13->nSize) {
        lVar16 = 0;
        do {
          iVar7 = pVVar13->pArray[lVar16];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00672cd4;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          pGVar12 = Gia_ManAppendObj(pGVar9);
          uVar4 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pGVar9->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = pGVar9->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + pGVar9->nObjs <= pGVar12)) {
LAB_00672cf3:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pGVar9->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = pGVar9->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + pGVar9->nObjs <= pGVar12)) goto LAB_00672cf3;
          pGVar3[iVar7].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
          lVar16 = lVar16 + 1;
          pVVar13 = p->vCis;
        } while (lVar16 < pVVar13->nSize);
      }
      if (0 < vChains->nSize) {
        lVar16 = 0;
        lVar17 = 0;
        do {
          Gia_ManDupFadd(pGVar9,p,(Vec_Int_t *)((long)&vChains->pArray->nCap + lVar16),vFadds,vMap,
                         vChains,pVVar8,vTruths);
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x10;
        } while (lVar17 < vChains->nSize);
      }
      pVVar13 = p->vCos;
      if (0 < pVVar13->nSize) {
        lVar16 = 0;
        do {
          iVar7 = pVVar13->pArray[lVar16];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00672cd4;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar7;
          Gia_ManDupWithFaddBoxes_rec
                    (pGVar9,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),vFadds,
                     vMap,vChains,pVVar8,vTruths);
          lVar16 = lVar16 + 1;
          pVVar13 = p->vCos;
        } while (lVar16 < pVVar13->nSize);
      }
      pVVar13 = p->vCos;
      if (0 < pVVar13->nSize) {
        lVar16 = 0;
        do {
          iVar7 = pVVar13->pArray[lVar16];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00672cd4:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar7;
          uVar18 = (uint)*(undefined8 *)pGVar3;
          uVar1 = pGVar3[-(ulong)(uVar18 & 0x1fffffff)].Value;
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(pGVar9,uVar18 >> 0x1d & 1 ^ uVar1);
          lVar16 = lVar16 + 1;
          pVVar13 = p->vCos;
        } while (lVar16 < pVVar13->nSize);
      }
      Gia_ManSetRegNum(pGVar9,p->nRegs);
      if (p->nRegs != 0) {
        if (fVerbose != 0) {
          puts(
              "Warning: Sequential design is coverted into combinational one by adding white boxes."
              );
        }
        pGVar9->nRegs = 0;
      }
      iVar7 = Gia_ManHasDangling(pGVar9);
      if (iVar7 != 0) {
        __assert_fail("!Gia_ManHasDangling(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x353,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
      }
      if (vFadds->pArray != (int *)0x0) {
        free(vFadds->pArray);
        vFadds->pArray = (int *)0x0;
      }
      if (vFadds != (Vec_Int_t *)0x0) {
        free(vFadds);
      }
      if (vMap->pArray != (int *)0x0) {
        free(vMap->pArray);
        vMap->pArray = (int *)0x0;
      }
      if (vMap != (Vec_Int_t *)0x0) {
        free(vMap);
      }
      if (0 < vChains->nCap) {
        lVar16 = 8;
        lVar17 = 0;
        do {
          pvVar6 = *(void **)((long)&vChains->pArray->nCap + lVar16);
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
            *(undefined8 *)((long)&vChains->pArray->nCap + lVar16) = 0;
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x10;
        } while (lVar17 < vChains->nCap);
      }
      if (vChains->pArray != (Vec_Int_t *)0x0) {
        free(vChains->pArray);
        vChains->pArray = (Vec_Int_t *)0x0;
      }
      vChains->nCap = 0;
      vChains->nSize = 0;
      free(vChains);
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
        pVVar8->pArray = (int *)0x0;
      }
      if (pVVar8 != (Vec_Int_t *)0x0) {
        free(pVVar8);
      }
      if (vTruths->pArray != (int *)0x0) {
        free(vTruths->pArray);
        vTruths->pArray = (int *)0x0;
      }
      if (vTruths != (Vec_Int_t *)0x0) {
        free(vTruths);
      }
      iVar7 = p->vCis->nSize;
      nBoxes = (pGVar9->vCis->nSize - iVar7) / 2;
      iVar19 = p->vCos->nSize;
      if (nBoxes != (pGVar9->vCos->nSize - iVar19) / 3) {
        __assert_fail("nBoxes == (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x35e,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
      }
      pTVar14 = Gia_ManGenerateTim(iVar7,iVar19,nBoxes,3,2);
      pGVar9->pManTime = pTVar14;
      pGVar15 = Gia_ManGenerateExtraAig(nBoxes,3,2);
      pGVar9->pAigExtra = pGVar15;
      if (fVerbose != 0) {
        iVar19 = 3;
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar16 = -1;
        }
        else {
          lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print(iVar19,"%s =","AIG with boxes construction time");
        Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar16 + local_48) / 1000000.0);
      }
    }
  }
  else {
    puts("Currently natural carry-chains cannot be detected when boxes are present.");
    pGVar9 = (Gia_Man_t *)0x0;
  }
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNaturalBoxes( Gia_Man_t * p, int nFaddMin, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;//, * pTemp;
    Vec_Int_t * vFadds, * vMap, * vMap2Chain, * vTruths, * vChain;
    Vec_Wec_t * vChains;
    Gia_Obj_t * pObj;  
    int i, nBoxes;
    if ( Gia_ManBoxNum(p) > 0 )
    {
        printf( "Currently natural carry-chains cannot be detected when boxes are present.\n" );
        return NULL;
    }
    assert( Gia_ManBoxNum(p) == 0 );

    // detect FADDs
    vFadds = Gia_ManDetectFullAdders( p, fVerbose, NULL );
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    // map MAJ into its FADD
    vMap = Gia_ManCreateMap( p, vFadds );
    // for each FADD, find the longest chain and reorder its inputs
    Gia_ManFindChains( p, vFadds, vMap );
    // returns the set of topmost MAJ nodes
    vChains = Gia_ManCollectTopmost( p, vFadds, vMap, nFaddMin );
    if ( fVerbose )
        Gia_ManPrintChains( p, vFadds, vMap, vChains );
    if ( Vec_WecSize(vChains) == 0 )
    {
        Vec_IntFree( vFadds );
        Vec_IntFree( vMap );
        Vec_WecFree( vChains );
        return Gia_ManDup( p );
    }
    // returns mapping of each MAJ into the topmost elements of its chain
    vMap2Chain = Gia_ManFindMapping( p, vFadds, vMap, vChains );
    // compute truth tables for FADDs
    vTruths = Gia_ManCollectTruthTables( p, vFadds );
    if ( fVerbose )
        Abc_PrintTime( 1, "Carry-chain detection time", Abc_Clock() - clk );

    // duplicate
    clk = Abc_Clock();
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Vec_WecForEachLevel( vChains, vChain, i )
        Gia_ManDupFadd( pNew, p, vChain, vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin0(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManRegNum(p) )
    {
        if ( fVerbose )
            printf( "Warning: Sequential design is coverted into combinational one by adding white boxes.\n" );
        pNew->nRegs = 0;
    }
    assert( !Gia_ManHasDangling(pNew) );

    // cleanup
    Vec_IntFree( vFadds );
    Vec_IntFree( vMap );
    Vec_WecFree( vChains );
    Vec_IntFree( vMap2Chain );
    Vec_IntFree( vTruths );
    
    // other information
    nBoxes = (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
    assert( nBoxes == (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    pNew->pManTime  = Gia_ManGenerateTim( Gia_ManCiNum(p), Gia_ManCoNum(p), nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
/*
    // normalize
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    pNew->pManTime  = pTemp->pManTime;  pTemp->pManTime  = NULL;
    pNew->pAigExtra = pTemp->pAigExtra; pTemp->pAigExtra = NULL;
    Gia_ManStop( pTemp );
*/
    //pNew = Gia_ManDupCollapse( pTemp = pNew, pNew->pAigExtra, NULL );
    //Gia_ManStop( pTemp );

    //Gia_ManIllustrateBoxes( pNew );
    if ( fVerbose )
        Abc_PrintTime( 1, "AIG with boxes construction time", Abc_Clock() - clk );
    return pNew;
}